

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall test_ethash_dir_creation::test_method(test_ethash_dir_creation *this)

{
  bool bVar1;
  ethash_io_rc eVar2;
  FILE *f;
  path local_150;
  char *local_130;
  char *local_128;
  shared_count sStack_120;
  undefined **local_118;
  ulong local_110;
  shared_count sStack_108;
  char **local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  f = (FILE *)0x0;
  local_40 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xdd);
  local_150.m_pathname._M_string_length._0_1_ = 0;
  local_150.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013aa18;
  local_150.m_pathname.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_150.m_pathname.field_2._8_8_ = (long)"\"\n" + 2;
  local_60 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_58 = "";
  local_118 = (undefined **)CONCAT44(local_118._4_4_,2);
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  eVar2 = ethash_io_prepare("./test_ethash_directory/",(ethash_h256_t)ZEXT1632(ZEXT816(0)),&f,0x40,
                            false);
  local_130 = (char *)CONCAT44(local_130._4_4_,eVar2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ethash_io_rc,ethash_io_rc>
            (&local_150,&local_60,0xdd,2,2,&local_118,"ETHASH_IO_MEMO_MISMATCH",&local_130,
             "ethash_io_prepare(\"./test_ethash_directory/\", seedhash, &f, 64, false)");
  local_70 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0xde);
  local_118 = (undefined **)CONCAT71(local_118._1_7_,f != (FILE *)0x0);
  local_110 = 0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_130 = "f";
  local_128 = "";
  local_150.m_pathname._M_string_length._0_1_ = 0;
  local_150.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013b118;
  local_150.m_pathname.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_90 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_88 = "";
  local_150.m_pathname.field_2._8_8_ = &local_130;
  boost::test_tools::tt_detail::report_assertion(&local_118,&local_150,&local_90,0xde,2,0,0);
  boost::detail::shared_count::~shared_count(&sStack_108);
  local_a0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0xe1);
  boost::filesystem::path::path(&local_150,"./test_ethash_directory/");
  bVar1 = boost::filesystem::is_directory(&local_150);
  local_130 = (char *)CONCAT71(local_130._1_7_,bVar1);
  local_128 = (char *)0x0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_100 = &local_c0;
  local_c0 = "fs::is_directory(fs::path(\"./test_ethash_directory/\"))";
  local_b8 = "";
  local_110 = local_110 & 0xffffffffffffff00;
  local_118 = &PTR__lazy_ostream_0013b118;
  sStack_108.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_d0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_c8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  std::__cxx11::string::~string((string *)&local_150);
  fclose((FILE *)f);
  boost::filesystem::path::path(&local_150,"./test_ethash_directory/");
  boost::filesystem::remove_all(&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ethash_dir_creation) {
	ethash_h256_t seedhash;
	FILE *f = NULL;
	memset(&seedhash, 0, 32);
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_MISMATCH,
		ethash_io_prepare("./test_ethash_directory/", seedhash, &f, 64, false)
	);
	BOOST_REQUIRE(f);

	// let's make sure that the directory was created
	BOOST_REQUIRE(fs::is_directory(fs::path("./test_ethash_directory/")));

	// cleanup
	fclose(f);
	fs::remove_all("./test_ethash_directory/");
}